

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O0

FString D_EscapeUserInfo(char *str)

{
  FString *pFVar1;
  char *in_RSI;
  char *local_18;
  char *str_local;
  FString *ret;
  
  FString::FString((FString *)str);
  for (local_18 = in_RSI; *local_18 != '\0'; local_18 = local_18 + 1) {
    if (*local_18 == '\\') {
      pFVar1 = FString::operator<<((FString *)str,'%');
      FString::operator<<(pFVar1,'/');
    }
    else if (*local_18 == '%') {
      pFVar1 = FString::operator<<((FString *)str,'%');
      FString::operator<<(pFVar1,'%');
    }
    else {
      FString::operator<<((FString *)str,*local_18);
    }
  }
  return (FString)str;
}

Assistant:

FString D_EscapeUserInfo (const char *str)
{
	FString ret;

	for (; *str != '\0'; ++str)
	{
		if (*str == '\\')
		{
			ret << '%' << '/';
		}
		else if (*str == '%')
		{
			ret << '%' << '%';
		}
		else
		{
			ret << *str;
		}
	}
	return ret;
}